

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O0

void cast_protection(void)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 in_RSI;
  char *local_40;
  char *local_38;
  int local_2c;
  char *hgolden;
  int gain;
  int natac;
  int l;
  int loglev;
  
  natac = 0;
  for (gain = u.ulevel; gain != 0; gain = gain / 2) {
    natac = natac + 1;
  }
  if ((int)(10 - ((int)u.uac - (uint)u.uspellprot)) / 10 < 4) {
    local_2c = (int)(10 - ((int)u.uac - (uint)u.uspellprot)) / 10;
  }
  else {
    local_2c = 3;
  }
  iVar2 = natac - (int)(uint)u.uspellprot / (4 - local_2c);
  if (iVar2 < 1) {
    pline("Your skin feels warm for a moment.",in_RSI,
          (long)(int)(uint)u.uspellprot % (long)(4 - local_2c) & 0xffffffff);
  }
  else {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar3 = hcolor("golden");
      if (u.uspellprot == '\0') {
        if ((((byte)u._1052_1_ >> 1 & 1) == 0) &&
           (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
          if ((u._1052_1_ & 1) == 0) {
            local_40 = "air";
            if (level->locations[u.ux][u.uy].typ < '\r') {
              local_40 = "stone";
            }
          }
          else {
            local_40 = mbodypart(u.ustuck,0x12);
          }
          local_38 = local_40;
        }
        else {
          local_38 = "water";
        }
        pcVar3 = an(pcVar3);
        pline("The %s around you begins to shimmer with %s haze.",local_38,pcVar3);
      }
      else {
        pline("The %s haze around you becomes more dense.",pcVar3);
      }
    }
    u.uspellprot = u.uspellprot + (char)iVar2;
    iVar2 = spell_skilltype(0x1a2);
    u.uspmtime = '\n';
    if (u.weapon_skills[iVar2].skill == '\x04') {
      u.uspmtime = '\x14';
    }
    if (u.usptime == '\0') {
      u.usptime = u.uspmtime;
    }
    find_ac();
  }
  return;
}

Assistant:

static void cast_protection(void)
{
	int loglev = 0;
	int l = u.ulevel;
	int natac = u.uac - u.uspellprot;
	int gain;

	/* loglev=log2(u.ulevel)+1 (1..5) */
	while (l) {
	    loglev++;
	    l /= 2;
	}

	/* The more u.uspellprot you already have, the less you get,
	 * and the better your natural ac, the less you get.
	 *
	 *	LEVEL AC    SPELLPROT from sucessive SPE_PROTECTION casts
	 *      1     10    0,  1,  2,  3,  4
	 *      1      0    0,  1,  2,  3
	 *      1    -10    0,  1,  2
	 *      2-3   10    0,  2,  4,  5,  6,  7,  8
	 *      2-3    0    0,  2,  4,  5,  6
	 *      2-3  -10    0,  2,  3,  4
	 *      4-7   10    0,  3,  6,  8,  9, 10, 11, 12
	 *      4-7    0    0,  3,  5,  7,  8,  9
	 *      4-7  -10    0,  3,  5,  6
	 *      7-15 -10    0,  3,  5,  6
	 *      8-15  10    0,  4,  7, 10, 12, 13, 14, 15, 16
	 *      8-15   0    0,  4,  7,  9, 10, 11, 12
	 *      8-15 -10    0,  4,  6,  7,  8
	 *     16-30  10    0,  5,  9, 12, 14, 16, 17, 18, 19, 20
	 *     16-30   0    0,  5,  9, 11, 13, 14, 15
	 *     16-30 -10    0,  5,  8,  9, 10
	 */
	gain = loglev - (int)u.uspellprot / (4 - min(3,(10 - natac)/10));

	if (gain > 0) {
	    if (!Blind) {
		const char *hgolden = hcolor("golden");

		if (u.uspellprot)
		    pline("The %s haze around you becomes more dense.",
			      hgolden);
		else
		    pline("The %s around you begins to shimmer with %s haze.",
			(Underwater || Is_waterlevel(&u.uz)) ? "water" :
			 u.uswallow ? mbodypart(u.ustuck, STOMACH) :
			 IS_STWALL(level->locations[u.ux][u.uy].typ) ? "stone" : "air",
			      an(hgolden));
	    }
	    u.uspellprot += gain;
	    u.uspmtime =
		P_SKILL(spell_skilltype(SPE_PROTECTION)) == P_EXPERT ? 20 : 10;
	    if (!u.usptime)
		u.usptime = u.uspmtime;
	    find_ac();
	} else {
	    pline("Your skin feels warm for a moment.");
	}
}